

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_printf_describe(roaring_bitmap_t *r)

{
  ushort uVar1;
  uint uVar2;
  char *pcVar3;
  int local_1c;
  int i;
  roaring_array_t *ra;
  roaring_bitmap_t *r_local;
  
  printf("{");
  for (local_1c = 0; local_1c < (r->high_low_container).size; local_1c = local_1c + 1) {
    uVar1 = (r->high_low_container).keys[local_1c];
    pcVar3 = get_full_container_name
                       ((r->high_low_container).containers[local_1c],
                        (r->high_low_container).typecodes[local_1c]);
    uVar2 = container_get_cardinality
                      ((r->high_low_container).containers[local_1c],
                       (r->high_low_container).typecodes[local_1c]);
    printf("%d: %s (%d)",(ulong)uVar1,pcVar3,(ulong)uVar2);
    if ((r->high_low_container).typecodes[local_1c] == '\x04') {
      printf("(shared count = %u )",
             (ulong)*(uint *)((long)(r->high_low_container).containers[local_1c] + 0xc));
    }
    if (local_1c + 1 < (r->high_low_container).size) {
      printf(", ");
    }
  }
  printf("}");
  return;
}

Assistant:

void roaring_bitmap_printf_describe(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    printf("{");
    for (int i = 0; i < ra->size; ++i) {
        printf("%d: %s (%d)", ra->keys[i],
               get_full_container_name(ra->containers[i], ra->typecodes[i]),
               container_get_cardinality(ra->containers[i], ra->typecodes[i]));

        if (ra->typecodes[i] == SHARED_CONTAINER_TYPE) {
            printf(
                "(shared count = %" PRIu32 " )",
                    CAST_shared(ra->containers[i])->counter);
        }

        if (i + 1 < ra->size) {
            printf(", ");
        }
    }
    printf("}");
}